

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O0

void __thiscall
helics::apps::Recorder::Recorder
          (Recorder *this,string_view appName,CoreApp *core,FederateInfo *fedInfo)

{
  string_view appName_00;
  undefined8 *in_RDI;
  unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
  *in_stack_ffffffffffffff40;
  Recorder *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  FederateInfo *in_stack_ffffffffffffff80;
  CoreApp *in_stack_ffffffffffffff88;
  App *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  
  appName_00._M_str = in_stack_ffffffffffffffa0;
  appName_00._M_len = in_stack_ffffffffffffff98;
  App::App(in_stack_ffffffffffffff90,appName_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80)
  ;
  *in_RDI = &PTR__Recorder_00922960;
  *(undefined1 *)(in_RDI + 0x14) = 0;
  *(undefined1 *)((long)in_RDI + 0xa1) = 0;
  in_RDI[0x15] = 0;
  std::unique_ptr<helics::CloningFilter,std::default_delete<helics::CloningFilter>>::
  unique_ptr<std::default_delete<helics::CloningFilter>,void>(in_stack_ffffffffffffff40);
  CLI::std::
  vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
  ::vector((vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
            *)0x1786c4);
  CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::deque
            ((deque<helics::Input,_std::allocator<helics::Input>_> *)0x1786da);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1786f2);
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::deque
            ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)0x178708);
  this_00 = (Recorder *)(in_RDI + 0x31);
  std::unique_ptr<helics::Endpoint,std::default_delete<helics::Endpoint>>::
  unique_ptr<std::default_delete<helics::Endpoint>,void>
            ((unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_> *)this_00);
  CLI::std::
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ::vector((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
            *)0x178736);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x35);
  CLI::std::
  map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  ::map((map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
         *)0x17874c);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
         *)0x178762);
  CLI::std::
  map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  ::map((map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
         *)0x178778);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
         *)0x17878e);
  CLI::std::
  vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>::
  vector((vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
          *)0x1787a4);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1787ba);
  std::__cxx11::string::string(this_01);
  initialSetup(this_00);
  return;
}

Assistant:

Recorder::Recorder(std::string_view appName, CoreApp& core, const FederateInfo& fedInfo):
    App(appName, core, fedInfo)
{
    initialSetup();
}